

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.cxx
# Opt level: O3

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_cli_req
          (raft_server *this,req_msg *req,req_ext_params *ext_params,uint64_t timestamp_us)

{
  char cVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  __pthread_internal_list *p_Var4;
  __pthread_internal_list *p_Var5;
  long lVar6;
  long *plVar7;
  pointer psVar8;
  size_t us;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  element_type *this_01;
  long lVar13;
  element_type *this_02;
  id iVar14;
  undefined8 uVar15;
  debugging_options *pdVar16;
  ulong *puVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  ulong *puVar20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  pthread_mutex_t *in_R8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  ulong uVar22;
  _func_int **pp_Var23;
  bool bVar24;
  ptr<resp_msg> pVar25;
  ulong last_idx;
  ptr<commit_ret_elem> elem;
  ptr<buffer> buf;
  ptr<raft_params> params;
  element_type *local_148;
  undefined1 local_138 [32];
  thread local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  pthread_mutex_t *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  undefined1 local_e8 [32];
  _Any_data local_c8;
  undefined8 local_b8;
  __pthread_internal_list *local_b0;
  undefined1 local_a8 [16];
  function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
  local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_118._M_id._M_thread = (id)0;
  uVar15 = req[9].super_msg_base._vptr_msg_base[1];
  local_f8 = in_R8;
  context::get_params((context *)&stack0xffffffffffffffc0);
  this_01 = (element_type *)operator_new(0xb0);
  (this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  this_01->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005bb3a0;
  p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            &(this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
             super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  uVar2 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = *(undefined4 *)((long)&req->commit_idx_ + 4);
  (this_01->bg_commit_thread_)._M_id._M_thread = uVar15;
  *(undefined4 *)&(this_01->bg_append_thread_)._M_id._M_thread = 4;
  *(undefined4 *)((long)&(this_01->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
  *(undefined4 *)&this_01->bg_append_ea_ = uVar3;
  (this_01->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_005bb3f0;
  (this_01->priority_change_timer_).t_created_.__d.__r = 0;
  (this_01->priority_change_timer_).duration_us_ = 0;
  *(undefined8 *)&(this_01->priority_change_timer_).first_event_fired_ = 0;
  (this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)((long)&(this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)((long)&(this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18)
       = 0;
  *(undefined8 *)((long)&(this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20)
       = 0;
  this_01->votes_responded_ = 0;
  this_01->votes_granted_ = 0;
  (this_01->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (this_01->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (this_01->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined4 *)&(this_01->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&(this_01->initialized_)._M_base = 0;
  this_01->id_ = 0;
  this_01->my_priority_ = 0;
  *(undefined1 *)&this_01->target_priority_ = 0;
  local_c8._M_unused._0_8_ = (undefined8)uVar15;
  if ((*(int *)&req[8].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage == 3) &&
     (((ulong)req[3].super_msg_base._vptr_msg_base & 1) == 0)) {
    if (*(element_type **)(timestamp_us + 0x20) == (element_type *)uVar15 ||
        *(element_type **)(timestamp_us + 0x20) == (element_type *)0x0) {
      p_Var4 = *(__pthread_internal_list **)
                ((long)&ext_params[1].after_precommit_.super__Function_base._M_functor + 8);
      p_Var5 = (__pthread_internal_list *)
               ext_params[1].after_precommit_.super__Function_base._M_manager;
      lVar13 = (long)p_Var5 - (long)p_Var4;
      local_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
      if (lVar13 == 0) {
        local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_148 = (element_type *)0x0;
      }
      else {
        local_c8._8_8_ = lVar13 >> 4;
        local_a8._8_8_ =
             (long)&((__pthread_internal_list *)local_c8._8_8_)->__prev +
             (ulong)((__pthread_internal_list *)local_c8._8_8_ == (__pthread_internal_list *)0x0);
        lVar13 = 0;
        uVar22 = 0;
        this_02 = (element_type *)0x0;
        local_e8._24_8_ = p_Var19;
        local_b8 = p_Var5;
        local_b0 = p_Var4;
        local_a8._0_8_ = ext_params;
        do {
          lVar6 = *(long *)((long)&ext_params[1].after_precommit_.super__Function_base._M_functor +
                           8);
          if ((ulong)((long)ext_params[1].after_precommit_.super__Function_base._M_manager - lVar6
                     >> 4) <= uVar22) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar22);
LAB_0018fab5:
            iVar12 = std::__throw_out_of_range_fmt
                               ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                ,uVar22);
            goto LAB_0018fac6;
          }
          plVar7 = *(long **)(lVar6 + lVar13);
          *plVar7 = uVar15;
          plVar7[4] = (long)local_f8;
          iVar14._M_thread =
               store_log_entry((raft_server *)req,(ptr<log_entry> *)(lVar6 + lVar13),0);
          psVar8 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if ((psVar8 != (pointer)0x0) &&
             (iVar12 = (*(code *)(psVar8->
                                 super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr[1].buff_.
                                 super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)(), 4 < iVar12)) {
            psVar8 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      ((string *)local_138,"append at log_idx %lu, timestamp %lu",iVar14._M_thread,
                       local_f8);
            (*(code *)(psVar8->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar8,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                       ,"handle_cli_req",0x7b,(string *)local_138);
            ext_params = (req_ext_params *)local_a8._0_8_;
            if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
              operator_delete((void *)local_138._0_8_);
              ext_params = (req_ext_params *)local_a8._0_8_;
            }
          }
          local_118._M_id._M_thread = (id)(id)iVar14._M_thread;
          if ((ulong)((long)*(_Manager_type *)((long)ext_params + 0x40) -
                      *(long *)((long)ext_params + 0x38) >> 4) <= uVar22) goto LAB_0018fab5;
          lVar6 = *(long *)(*(long *)((long)ext_params + 0x38) + lVar13);
          local_e8._0_8_ = *(undefined8 *)(lVar6 + 0x10);
          local_e8._8_8_ = *(long *)(lVar6 + 0x18);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count +
                   1;
            }
          }
          buffer::pos((buffer *)local_e8._0_8_,0);
          local_110._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_id._M_thread;
          local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8;
          (**(code **)(*(long *)req[9].last_log_term_ + 0x30))
                    (local_138,(long *)req[9].last_log_term_,local_138 + 0x28);
          local_148 = (element_type *)local_138._8_8_;
          local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._0_8_;
          local_138._0_8_ = (element_type *)0x0;
          local_138._8_8_ = (element_type *)0x0;
          if ((this_02 != (element_type *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02),
             (element_type *)local_138._8_8_ != (element_type *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
          }
          uVar15 = local_c8._M_unused._0_8_;
          if (*(long *)(timestamp_us + 0x10) != 0) {
            local_138._0_8_ = local_118._M_id._M_thread;
            local_138._8_8_ = local_c8._M_unused._M_object;
            local_138._16_8_ = *(undefined8 *)(timestamp_us + 0x28);
            (**(code **)(timestamp_us + 0x18))(timestamp_us,local_138);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
          }
          uVar22 = uVar22 + 1;
          lVar13 = lVar13 + 0x10;
          this_02 = local_148;
        } while (local_a8._8_8_ != uVar22);
        if ((__pthread_internal_list *)local_b8 == local_b0) {
          p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._24_8_;
        }
        else {
          plVar7 = *(long **)&req[9].super_msg_base.type_;
          (**(code **)(*plVar7 + 0x38))(plVar7,(long)local_118._M_id._M_thread - local_c8._8_8_);
          p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._24_8_;
        }
      }
      this = (raft_server *)local_f0._M_pi;
      try_update_precommit_index((raft_server *)req,(ulong)local_118._M_id._M_thread,10);
      uVar15 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      local_e8._4_4_ = *(undefined4 *)((long)&req->commit_idx_ + 4);
      local_e8._0_4_ =
           *(undefined4 *)
            &(req->log_entries_).
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      local_e8._8_4_ = 0xffffffff;
      local_e8._16_8_ = local_138 + 0x20;
      lVar13 = *(long *)&req[4].super_msg_base.dst_;
      if (*(long *)(lVar13 + 0x80) != 0) {
        local_110._M_pi._0_4_ = 3;
        local_138._0_8_ = local_e8;
        iVar12 = (**(code **)(lVar13 + 0x88))(lVar13 + 0x70);
        if (iVar12 == -1) {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this)->_vptr__Sp_counted_base =
               (_func_int **)0x0;
          (((enable_shared_from_this<nuraft::raft_server> *)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this)->_M_use_count)->_M_weak_this).
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          _Var18._M_pi = extraout_RDX_03;
          goto LAB_0018f1bd;
        }
      }
      pdVar16 = debugging_options::get_instance();
      us = (pdVar16->handle_cli_req_sleep_us_).super___atomic_base<unsigned_long>._M_i;
      if (us != 0) {
        timer_helper::sleep_us(us);
      }
      get_config((raft_server *)local_138);
      cVar1 = *(char *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138._0_8_ + 0x10))->
                        _vptr__Sp_counted_base;
      if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
      }
      if (cVar1 == '\0') {
        local_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<nuraft::raft_server::commit_ret_elem,std::allocator<nuraft::raft_server::commit_ret_elem>>
                  (&local_108,(commit_ret_elem **)(local_138 + 0x28),
                   (allocator<nuraft::raft_server::commit_ret_elem> *)local_138);
        (local_110._M_pi)->_vptr__Sp_counted_base = (_func_int **)local_118._M_id._M_thread;
        local_110._M_pi[0xb]._M_use_count = -2;
        local_f8 = (pthread_mutex_t *)&req[0x10].super_msg_base.term_;
        iVar12 = pthread_mutex_lock(local_f8);
        if (iVar12 != 0) {
LAB_0018fac6:
          std::__throw_system_error(iVar12);
        }
        puVar17 = (ulong *)req[0xf].log_entries_.
                           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        if (puVar17 == (ulong *)0x0) {
LAB_0018f728:
          local_138._0_8_ = local_118._M_id._M_thread;
          local_138._8_8_ = local_110._M_pi;
          local_138._16_8_ = local_108._M_pi;
          if ((element_type *)local_108._M_pi != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)
                        &(local_108._M_pi)->_M_use_count)->_M_weak_this).
                       super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)
                             &(local_108._M_pi)->_M_use_count)->_M_weak_this).
                            super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)
                        &(local_108._M_pi)->_M_use_count)->_M_weak_this).
                       super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)
                             &(local_108._M_pi)->_M_use_count)->_M_weak_this).
                            super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + 1;
            }
          }
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
          ::
          _M_emplace_unique<std::pair<unsigned_long,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
                      *)&req[0xf].last_log_idx_,
                     (pair<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_> *)
                     local_138);
          if ((element_type *)local_138._16_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._16_8_);
          }
        }
        else {
          puVar20 = &req[0xf].commit_idx_;
          do {
            bVar24 = (((pointer)(puVar17 + 4))->
                     super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr <
                     (ulong)local_118._M_id._M_thread;
            if (!bVar24) {
              puVar20 = puVar17;
            }
            puVar17 = (ulong *)puVar17[(ulong)bVar24 + 2];
          } while (puVar17 != (ulong *)0x0);
          if ((puVar20 == &req[0xf].commit_idx_) ||
             ((ulong)local_118._M_id._M_thread <
              (((pointer)(puVar20 + 4))->
              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr))
          goto LAB_0018f728;
          local_110._M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar20 + 5))->_M_pi;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_108,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar20 + 6));
          psVar8 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if ((psVar8 != (pointer)0x0) &&
             (iVar12 = (*(code *)(psVar8->
                                 super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr[1].buff_.
                                 super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)(), 5 < iVar12)) {
            psVar8 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      ((string *)local_138,"commit thread was faster than this thread: %p",
                       local_110._M_pi);
            (*(code *)(psVar8->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar8,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                       ,"handle_cli_req",0xaa,local_138);
            if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
              operator_delete((void *)local_138._0_8_);
            }
          }
        }
        context::get_params((context *)local_138);
        iVar12 = *(int *)(local_138._0_8_ + 0x58);
        if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
        }
        _Var21._M_pi = local_108._M_pi;
        _Var18._M_pi = local_110._M_pi;
        if (iVar12 == 1) {
          pp_Var23 = local_110._M_pi[0xc]._vptr__Sp_counted_base;
          if (pp_Var23 == (_func_int **)0x0) {
            cs_new<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>
                      ();
            uVar10 = local_138._8_8_;
            uVar9 = local_138._0_8_;
            local_138._0_8_ = (element_type *)0x0;
            local_138._8_8_ = (element_type *)0x0;
            uVar11 = local_138._8_8_;
            this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       &local_110._M_pi[0xc]._M_use_count;
            local_110._M_pi[0xc]._vptr__Sp_counted_base = (_func_int **)uVar9;
            local_138._8_4_ = (undefined4)uVar10;
            local_138._12_4_ = SUB84(uVar10,4);
            local_110._M_pi[0xc]._M_use_count = local_138._8_4_;
            local_110._M_pi[0xc]._M_weak_count = local_138._12_4_;
            local_138._8_8_ = uVar11;
            if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
               (element_type *)local_138._8_8_ != (element_type *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
            }
            pp_Var23 = local_110._M_pi[0xc]._vptr__Sp_counted_base;
          }
          lVar13 = *(long *)&local_110._M_pi[0xc]._M_use_count;
          if (lVar13 != 0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(lVar13 + 8) = *(int *)(lVar13 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(lVar13 + 8) = *(int *)(lVar13 + 8) + 1;
            }
          }
          local_98.super__Function_base._M_manager = (_Manager_type)0x0;
          local_98._M_invoker = (_Invoker_type)0x0;
          local_98.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
          local_98.super__Function_base._M_functor._8_8_ = 0;
          local_98.super__Function_base._M_functor._M_unused._M_object = operator_new(0x28);
          *(code **)local_98.super__Function_base._M_functor._M_unused._0_8_ =
               handle_cli_req_callback_async;
          *(undefined8 *)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 8) = 0;
          *(_func_int ***)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
               pp_Var23;
          *(long *)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = lVar13;
          *(req_msg **)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 0x20) = req
          ;
          local_98._M_invoker =
               std::
               _Function_handler<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_(),_std::_Bind<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>)>_>
               ::_M_invoke;
          local_98.super__Function_base._M_manager =
               std::
               _Function_handler<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_(),_std::_Bind<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>)>_>
               ::_M_manager;
          std::
          function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
          ::operator=((function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
                       *)&this_01->votes_responded_,&local_98);
          this = (raft_server *)local_f0._M_pi;
          if (local_98.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_98.super__Function_base._M_manager)(&local_98,&local_98,3);
          }
        }
        else {
          if ((element_type *)local_108._M_pi != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)
                        &(local_108._M_pi)->_M_use_count)->_M_weak_this).
                       super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)
                             &(local_108._M_pi)->_M_use_count)->_M_weak_this).
                            super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)
                        &(local_108._M_pi)->_M_use_count)->_M_weak_this).
                       super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)
                             &(local_108._M_pi)->_M_use_count)->_M_weak_this).
                            super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + 1;
            }
          }
          local_68 = (code *)0x0;
          pcStack_60 = (code *)0x0;
          local_78._M_unused._M_object = (void *)0x0;
          local_78._8_8_ = 0;
          local_78._M_unused._M_object = operator_new(0x28);
          *(code **)local_78._M_unused._0_8_ = handle_cli_req_callback;
          *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_78._M_unused._0_8_ + 0x10)
               = _Var18._M_pi;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_78._M_unused._0_8_ + 0x18)
               = _Var21._M_pi;
          *(req_msg **)((long)local_78._M_unused._0_8_ + 0x20) = req;
          pcStack_60 = std::
                       _Function_handler<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>),_std::_Bind<std::shared_ptr<nuraft::resp_msg>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::shared_ptr<nuraft::resp_msg>)>_>
                       ::_M_invoke;
          local_68 = std::
                     _Function_handler<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>),_std::_Bind<std::shared_ptr<nuraft::resp_msg>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::shared_ptr<nuraft::resp_msg>)>_>
                     ::_M_manager;
          std::function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)>::
          operator=((function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)>
                     *)((long)&(this_01->priority_change_timer_).lock_.super___mutex_base._M_mutex +
                       8),(function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)>
                           *)&local_78);
          this = (raft_server *)local_f0._M_pi;
          if (local_68 != (code *)0x0) {
            (*local_68)(&local_78,&local_78,__destroy_functor);
          }
        }
        pthread_mutex_unlock(local_f8);
        _Var18._M_pi = extraout_RDX_05;
        _Var21._M_pi = local_108._M_pi;
      }
      else {
        psVar8 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((psVar8 != (pointer)0x0) &&
           (iVar12 = (*(code *)(psVar8->
                               super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr[1].buff_.
                               super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )(), 4 < iVar12)) {
          psVar8 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          msg_if_given_abi_cxx11_
                    ((string *)local_138,"asynchronously replicated %lu, return value %p",
                     local_118._M_id._M_thread,local_100._M_pi);
          (*(code *)(psVar8->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)
                    (psVar8,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                     ,"handle_cli_req",0xca,local_138);
          if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_);
          }
        }
        local_50 = (element_type *)local_100._M_pi;
        local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148;
        if (local_148 != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(local_148->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                     super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(int *)&(local_148->super_enable_shared_from_this<nuraft::raft_server>).
                          _M_weak_this.
                          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
            UNLOCK();
          }
          else {
            *(int *)&(local_148->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                     super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(int *)&(local_148->super_enable_shared_from_this<nuraft::raft_server>).
                          _M_weak_this.
                          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
          }
        }
        (this_01->priority_change_timer_).t_created_.__d.__r = (rep)local_100._M_pi;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &(this_01->priority_change_timer_).duration_us_,&local_48);
        _Var18._M_pi = extraout_RDX_04;
        _Var21._M_pi = local_48._M_pi;
      }
      if ((element_type *)_Var21._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var21._M_pi);
        _Var18._M_pi = extraout_RDX_06;
      }
      *(undefined8 *)&(this_01->initialized_)._M_base = uVar15;
      *(undefined1 *)&this_01->target_priority_ = 1;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this = p_Var19;
      (((enable_shared_from_this<nuraft::raft_server> *)((long)this + 8))->_M_weak_this).
      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
      this_01 = (element_type *)0x0;
      goto LAB_0018f1bd;
    }
    *(undefined4 *)&(this_01->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0xfffffff5
    ;
    this->_vptr_raft_server = (_func_int **)p_Var19;
    (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
  }
  else {
    *(undefined4 *)&(this_01->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0xfffffffd
    ;
    this->_vptr_raft_server = (_func_int **)p_Var19;
    (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
  }
  local_148 = (element_type *)0x0;
  this_01 = (element_type *)0x0;
  _Var18._M_pi = extraout_RDX;
LAB_0018f1bd:
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    _Var18._M_pi = extraout_RDX_00;
  }
  if (local_148 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148);
    _Var18._M_pi = extraout_RDX_01;
  }
  if (this_01 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    _Var18._M_pi = extraout_RDX_02;
  }
  pVar25.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var18._M_pi;
  pVar25.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar25.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_cli_req(req_msg& req,
                                          const req_ext_params& ext_params,
                                          uint64_t timestamp_us)
{
    ptr<resp_msg> resp = nullptr;
    ulong last_idx = 0;
    ptr<buffer> ret_value = nullptr;
    ulong resp_idx = 1;
    ulong cur_term = state_->get_term();
    ptr<raft_params> params = ctx_->get_params();

    resp = cs_new<resp_msg>( cur_term,
                             msg_type::append_entries_response,
                             id_,
                             leader_ );
    if (role_ != srv_role::leader || write_paused_) {
        resp->set_result_code( cmd_result_code::NOT_LEADER );
        return resp;
    }

    if (ext_params.expected_term_) {
        // If expected term is given, check the current term.
        if (ext_params.expected_term_ != cur_term) {
            resp->set_result_code( cmd_result_code::TERM_MISMATCH );
            return resp;
        }
    }

    std::vector< ptr<log_entry> >& entries = req.log_entries();
    size_t num_entries = entries.size();

    for (size_t i = 0; i < num_entries; ++i) {
        // force the log's term to current term
        entries.at(i)->set_term(cur_term);
        entries.at(i)->set_timestamp(timestamp_us);

        ulong next_slot = store_log_entry(entries.at(i));
        p_db("append at log_idx %" PRIu64 ", timestamp %" PRIu64,
             next_slot, timestamp_us);
        last_idx = next_slot;

        ptr<buffer> buf = entries.at(i)->get_buf_ptr();
        buf->pos(0);
        ret_value = state_machine_->pre_commit_ext
                    ( state_machine::ext_op_params( last_idx, buf ) );

        if (ext_params.after_precommit_) {
            req_ext_cb_params cb_params;
            cb_params.log_idx = last_idx;
            cb_params.log_term = cur_term;
            cb_params.context = ext_params.context_;
            ext_params.after_precommit_(cb_params);
        }
    }
    if (num_entries) {
        log_store_->end_of_append_batch(last_idx - num_entries, num_entries);
    }
    try_update_precommit_index(last_idx);
    resp_idx = log_store_->next_slot();

    // Finished appending logs and pre_commit of itself.
    cb_func::Param param(id_, leader_);
    param.ctx = &last_idx;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::AppendLogs, &param);
    if (rc == CbReturnCode::ReturnNull) return nullptr;

    size_t sleep_us = debugging_options::get_instance()
                      .handle_cli_req_sleep_us_.load(std::memory_order_relaxed);
    if (sleep_us) {
        // Sleep if the debugging option is given.
        timer_helper::sleep_us(sleep_us);
    }

    if (!get_config()->is_async_replication()) {
        // Sync replication:
        //   Set callback function for `last_idx`.
        ptr<commit_ret_elem> elem = cs_new<commit_ret_elem>();
        elem->idx_ = last_idx;
        elem->result_code_ = cmd_result_code::TIMEOUT;

        {   auto_lock(commit_ret_elems_lock_);
            auto entry = commit_ret_elems_.find(last_idx);
            if (entry != commit_ret_elems_.end()) {
                // Commit thread was faster than this.
                elem = entry->second;
                p_tr("commit thread was faster than this thread: %p", elem.get());
            } else {
                commit_ret_elems_.insert( std::make_pair(last_idx, elem) );
            }

            switch (ctx_->get_params()->return_method_) {
            case raft_params::blocking:
            default:
                // Blocking call: set callback function waiting for the result.
                resp->set_cb( std::bind( &raft_server::handle_cli_req_callback,
                                         this,
                                         elem,
                                         std::placeholders::_1 ) );
                break;

            case raft_params::async_handler:
                // Async handler: create & set async result object.
                if (!elem->async_result_) {
                    elem->async_result_ = cs_new< cmd_result< ptr<buffer> > >();
                }
                resp->set_async_cb
                      ( std::bind( &raft_server::handle_cli_req_callback_async,
                                   this,
                                   elem->async_result_ ) );
                break;
            }
        }

    } else {
        // Async replication:
        //   Immediately return with the result of pre-commit.
        p_dv( "asynchronously replicated %" PRIu64 ", return value %p",
              last_idx, ret_value.get() );
        resp->set_ctx(ret_value);
    }

    resp->accept(resp_idx);
    return resp;
}